

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O1

DdNode * GetSingleOutputFunctionRemapped
                   (DdManager *dd,DdNode **pOutputs,int nOuts,DdNode **pbVarsEnc,int nVarsEnc)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  int iVar3;
  DdNode *pDVar4;
  ulong uVar5;
  long lVar6;
  
  Cudd_AutodynDisable(dd);
  if (0 < nOuts) {
    uVar5 = 0;
    do {
      pDVar1 = Cudd_Support(dd,pOutputs[uVar5]);
      Cudd_Ref(pDVar1);
      pDVar2 = dd->one;
      if (pDVar1 != pDVar2) {
        iVar3 = 0;
        pDVar4 = pDVar1;
        do {
          GetSingleOutputFunctionRemapped::Permute[pDVar4->index] = iVar3;
          iVar3 = iVar3 + 1;
          pDVar4 = (pDVar4->type).kids.T;
        } while (pDVar4 != pDVar2);
      }
      pDVar2 = Cudd_bddPermute(dd,pOutputs[uVar5],GetSingleOutputFunctionRemapped::Permute);
      GetSingleOutputFunctionRemapped::pRemapped[uVar5] = pDVar2;
      Cudd_Ref(pDVar2);
      Cudd_RecursiveDeref(dd,pDVar1);
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nOuts);
  }
  pDVar2 = Extra_bddEncodingBinary
                     (dd,GetSingleOutputFunctionRemapped::pRemapped,nOuts,pbVarsEnc,nVarsEnc);
  Cudd_Ref(pDVar2);
  pDVar1 = Cudd_BddToAdd(dd,pDVar2);
  Cudd_Ref(pDVar1);
  Cudd_RecursiveDeref(dd,pDVar2);
  if (0 < nOuts) {
    lVar6 = 0;
    do {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)GetSingleOutputFunctionRemapped::pRemapped + lVar6))
      ;
      lVar6 = lVar6 + 8;
    } while ((ulong)(uint)nOuts << 3 != lVar6);
  }
  Cudd_Deref(pDVar1);
  return pDVar1;
}

Assistant:

DdNode * GetSingleOutputFunctionRemapped( DdManager * dd, DdNode ** pOutputs, int nOuts, DdNode ** pbVarsEnc, int nVarsEnc )
// returns the ADD of the remapped function
{
    static int Permute[MAXINPUTS];
    static DdNode * pRemapped[MAXOUTPUTS];

    DdNode * bSupp, * bTemp;
    int i, Counter;
    DdNode * bFunc;
    DdNode * aFunc;

    Cudd_AutodynDisable(dd);

    // perform the remapping
    for ( i = 0; i < nOuts; i++ )
    {
        // get support
        bSupp = Cudd_Support( dd, pOutputs[i] );    Cudd_Ref( bSupp );

        // create the variable map
        Counter = 0;
        for ( bTemp = bSupp; bTemp != dd->one; bTemp = cuddT(bTemp) )
            Permute[bTemp->index] = Counter++;

        // transfer the BDD and remap it
        pRemapped[i] = Cudd_bddPermute( dd, pOutputs[i], Permute );  Cudd_Ref( pRemapped[i] );

        // remove support
        Cudd_RecursiveDeref( dd, bSupp );
    }
    
    // perform the encoding
    bFunc = Extra_bddEncodingBinary( dd, pRemapped, nOuts, pbVarsEnc, nVarsEnc );   Cudd_Ref( bFunc );

    // convert to ADD
    aFunc = Cudd_BddToAdd( dd, bFunc );  Cudd_Ref( aFunc );
    Cudd_RecursiveDeref( dd, bFunc );

    // deref the intermediate results
    for ( i = 0; i < nOuts; i++ )
        Cudd_RecursiveDeref( dd, pRemapped[i] );

    Cudd_Deref( aFunc );
    return aFunc;
}